

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorstream.h
# Opt level: O2

void __thiscall
dlib::vectorstream::vectorstream(vectorstream *this,vector<char,_std::allocator<char>_> *buffer)

{
  std::ios::ios((ios *)&this->field_0x68);
  *(undefined8 *)this = 0x331870;
  *(undefined8 *)&this->field_0x68 = 0x3318c0;
  *(undefined8 *)&this->field_0x10 = 0x331898;
  std::iostream::iostream(this,(streambuf *)&PTR_construction_vtable_24__003318d8);
  *(undefined8 *)this = 0x331870;
  *(undefined8 *)&this->field_0x68 = 0x3318c0;
  *(undefined8 *)&this->field_0x10 = 0x331898;
  vector_streambuf::vector_streambuf(&this->buf,buffer);
  return;
}

Assistant:

vectorstream (
            std::vector<char>& buffer
        ) :
            std::iostream(&buf),
            buf(buffer)
        {}